

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrainManager.hpp
# Opt level: O2

void __thiscall sjtu::TrainManager::query_ticket(TrainManager *this,int argc,string *argv)

{
  BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_> *pBVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  long lVar5;
  pair<unsigned_int,_bool> pVar6;
  pair<unsigned_int,_bool> pVar7;
  ostream *poVar8;
  pointer pcVar9;
  undefined4 extraout_var;
  recordType *prVar10;
  invalid_command *this_00;
  uint w_;
  uint uVar11;
  undefined1 *puVar12;
  string *psVar13;
  uint uVar14;
  pointer pcVar15;
  vector<sjtu::recordType> records;
  string keyword;
  string date;
  string station [2];
  string local_1128;
  string local_1108;
  string local_10e8;
  recordType rec;
  uint bits [2] [512];
  
  lVar5 = 0x10;
  do {
    puVar12 = (undefined1 *)((long)&station[0]._M_dataplus._M_p + lVar5);
    *(undefined1 **)((long)station + lVar5 + -0x10) = puVar12;
    *(undefined8 *)((long)station + lVar5 + -8) = 0;
    *puVar12 = 0;
    lVar5 = lVar5 + 0x20;
  } while (lVar5 != 0x50);
  date._M_dataplus._M_p = (pointer)&date.field_2;
  date._M_string_length = 0;
  date.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&keyword,"",(allocator *)bits);
  lVar5 = 0;
  do {
    if (argc <= lVar5) {
      pBVar1 = this->StationBpTree;
      std::__cxx11::string::string((string *)&local_1108,(string *)station);
      bits[0]._0_8_ = StringHasher::operator()((StringHasher *)&this->field_0x10,&local_1108);
      pVar6 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                        (pBVar1,(unsigned_long_long *)bits);
      std::__cxx11::string::~string((string *)&local_1108);
      pBVar1 = this->StationBpTree;
      std::__cxx11::string::string((string *)&local_1128,(string *)(station + 1));
      bits[0]._0_8_ = StringHasher::operator()((StringHasher *)&this->field_0x10,&local_1128);
      pVar7 = BplusTree<unsigned_long_long,_unsigned_int,_100,_std::less<unsigned_long_long>_>::find
                        (pBVar1,(unsigned_long_long *)bits);
      std::__cxx11::string::~string((string *)&local_1128);
      if (((ulong)pVar7 >> 0x20 & 1) == 0 || ((ulong)pVar6 >> 0x20 & 1) == 0) {
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0);
        std::endl<char,std::char_traits<char>>(poVar8);
      }
      else {
        bitset_query(this,pVar6.first,bits[0]);
        bitset_query(this,pVar7.first,bits[1]);
        records.maxSize = 10;
        records.data = (recordType *)operator_new(0x5a0);
        records.currentLength = 0;
        pcVar15 = (pointer)0x0;
        for (lVar5 = 0; lVar5 != 0x200; lVar5 = lVar5 + 1) {
          for (uVar3 = bits[0][lVar5] & bits[1][lVar5]; bits[0][lVar5] = uVar3, uVar3 != 0;
              uVar3 = uVar3 ^ uVar14) {
            uVar14 = -uVar3 & uVar3;
            pcVar9 = pcVar15;
            uVar11 = uVar14;
            if (uVar14 != 0) {
              for (; uVar11 != 0; uVar11 = uVar11 >> 1) {
                pcVar9 = pcVar9 + 0xa7a8;
              }
              rec.trainID._M_dataplus._M_p = pcVar9;
              iVar4 = (*(this->TrainFile->super_FileManager_Base<sjtu::trainType>).
                        _vptr_FileManager_Base[2])(this->TrainFile,&rec);
              prVar10 = (recordType *)operator_new(0x90);
              recordType::recordType(prVar10);
              std::__cxx11::string::assign((char *)prVar10);
              std::__cxx11::string::_M_assign((string *)prVar10->station);
              std::__cxx11::string::_M_assign((string *)(prVar10->station + 1));
              std::__cxx11::string::string((string *)&local_10e8,(string *)&date);
              timeType::timeType((timeType *)&rec,&local_10e8);
              *(pointer *)prVar10->time = rec.trainID._M_dataplus._M_p;
              prVar10->time[0].hour = (undefined4)rec.trainID._M_string_length;
              prVar10->time[0].minute = rec.trainID._M_string_length._4_4_;
              std::__cxx11::string::~string((string *)&local_10e8);
              bVar2 = trainType::getrecord((trainType *)CONCAT44(extraout_var,iVar4),prVar10,false);
              if (bVar2) {
                vector<sjtu::recordType>::push_back(&records,prVar10);
              }
              recordType::~recordType(prVar10);
              operator_delete(prVar10,0x90);
              uVar3 = bits[0][lVar5];
            }
          }
          pcVar15 = pcVar15 + 0x14f500;
        }
        bVar2 = std::operator==(&keyword,"time");
        if (bVar2) {
          std::
          __sort<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_time>>
                    (records.data,&records);
        }
        else {
          std::
          __sort<sjtu::vector<sjtu::recordType>::iterator,__gnu_cxx::__ops::_Iter_comp_iter<sjtu::cmp_cost>>
                    (records.data,&records,records.data + records.currentLength);
        }
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::endl<char,std::char_traits<char>>(poVar8);
        prVar10 = records.data;
        for (lVar5 = (long)records.currentLength * 0x90; lVar5 != 0; lVar5 = lVar5 + -0x90) {
          recordType::recordType(&rec,prVar10);
          poVar8 = operator<<((ostream *)&std::cout,&rec);
          std::endl<char,std::char_traits<char>>(poVar8);
          recordType::~recordType(&rec);
          prVar10 = prVar10 + 1;
        }
        vector<sjtu::recordType>::~vector(&records);
      }
      std::__cxx11::string::~string((string *)&keyword);
      std::__cxx11::string::~string((string *)&date);
      lVar5 = 0x20;
      do {
        std::__cxx11::string::~string((string *)((long)&station[0]._M_dataplus._M_p + lVar5));
        lVar5 = lVar5 + -0x20;
      } while (lVar5 != -0x20);
      return;
    }
    bVar2 = std::operator==(argv,"-s");
    psVar13 = station;
    if (!bVar2) {
      bVar2 = std::operator==(argv,"-t");
      psVar13 = station + 1;
      if (!bVar2) {
        bVar2 = std::operator==(argv,"-d");
        psVar13 = &date;
        if (!bVar2) {
          bVar2 = std::operator==(argv,"-p");
          psVar13 = &keyword;
          if (!bVar2) {
            this_00 = (invalid_command *)__cxa_allocate_exception(0x68);
            invalid_command::invalid_command(this_00);
            __cxa_throw(this_00,&invalid_command::typeinfo,invalid_command::~invalid_command);
          }
        }
      }
    }
    std::__cxx11::string::_M_assign((string *)psVar13);
    lVar5 = lVar5 + 2;
    argv = argv + 2;
  } while( true );
}

Assistant:

void query_ticket(int argc , std::string *argv)
		{
			std::string station[2] , date , keyword = "";
			for (int i = 0;i < argc;i += 2)
				if (argv[i] == "-s") station[0] = argv[i + 1];
				else if (argv[i] == "-t") station[1] = argv[i + 1];
				else if (argv[i] == "-d") date = argv[i + 1];
				else if (argv[i] == "-p") keyword = argv[i + 1];
				else throw invalid_command();
			auto ret_s = StationBpTree -> find(hasher(station[0])) , ret_t = StationBpTree -> find(hasher(station[1]));
			if (ret_s.second == false || ret_t.second == false) std::cout << 0 << std::endl;
			else
			{
				unsigned int bits[2][WS];
				bitset_query(ret_s.first , bits[0]) , bitset_query(ret_t.first , bits[1]);
				vector<recordType> records;
				recordType *record;
				for (int i = 0;i < WS;++ i)
				{
					bits[0][i] &= bits[1][i];
					for (unsigned int w;bits[0][i];bits[0][i] ^= w)
					{
						w = bits[0][i] & (-bits[0][i]);
						if (!w) continue;
						int id = -1;
						for (unsigned int w_ = w;w_;w_ >>= 1) ++ id;
						trainType *train = TrainFile -> read((i * W + id + 1) * sizeof (DynamicFileManager<trainType>::valueType));
						record = new recordType , record -> trainID = train -> trainID;
						record -> station[0] = station[0] , record -> station[1] = station[1];
						record -> time[0] = timeType(date);
						if (train -> getrecord(record)) records.push_back(*record);
						delete record;
					}
				}
				if (keyword == "time") std::sort(records.begin() , records.end() , cmp_time());
				else std::sort(records.begin() , records.end() , cmp_cost());
				std::cout << records.size() << std::endl;
				for (auto rec : records) std::cout << rec << std::endl;
			}
		}